

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error ft_svg_glyph_init(FT_Glyph svg_glyph,FT_GlyphSlot slot)

{
  FT_Library pFVar1;
  FT_Memory memory;
  FT_Glyph pFStack_30;
  FT_Error error;
  FT_SvgGlyph glyph;
  FT_SVG_Document document;
  FT_ULong doc_length;
  FT_GlyphSlot slot_local;
  FT_Glyph svg_glyph_local;
  
  memory._4_4_ = 0;
  if (slot->format == FT_GLYPH_FORMAT_SVG) {
    if (slot->other == (void *)0x0) {
      memory._4_4_ = 0x25;
    }
    else {
      glyph = (FT_SvgGlyph)slot->other;
      if ((glyph->root).clazz == (FT_Glyph_Class *)0x0) {
        memory._4_4_ = 0x25;
      }
      else {
        document = (FT_SVG_Document)(glyph->root).clazz;
        pFStack_30 = svg_glyph;
        doc_length = (FT_ULong)slot;
        slot_local = (FT_GlyphSlot)svg_glyph;
        pFVar1 = (FT_Library)
                 ft_mem_qalloc(svg_glyph->library->memory,(FT_Long)document,
                               (FT_Error *)((long)&memory + 4));
        pFStack_30[1].library = pFVar1;
        if (memory._4_4_ == 0) {
          pFStack_30[1].clazz = (FT_Glyph_Class *)document;
          pFStack_30[1].format = *(FT_Glyph_Format *)(doc_length + 0x18);
          memcpy(&pFStack_30[1].advance,&(glyph->root).format,0x38);
          *(short *)&pFStack_30[3].library = (short)(glyph->metrics).x_scale;
          *(undefined2 *)((long)&pFStack_30[3].library + 2) =
               *(undefined2 *)((long)&(glyph->metrics).x_scale + 2);
          *(undefined2 *)((long)&pFStack_30[3].library + 4) =
               *(undefined2 *)((long)&(glyph->metrics).x_scale + 4);
          pFStack_30[3].clazz = (FT_Glyph_Class *)(glyph->metrics).y_scale;
          *(FT_Pos *)&pFStack_30[3].format = (glyph->metrics).ascender;
          pFStack_30[3].advance.x = (glyph->metrics).descender;
          pFStack_30[3].advance.y = (glyph->metrics).height;
          pFStack_30[4].library = (FT_Library)(glyph->metrics).max_advance;
          pFStack_30[4].clazz = *(FT_Glyph_Class **)&glyph->units_per_EM;
          memcpy(pFStack_30[1].library,(glyph->root).library,(size_t)document);
        }
      }
    }
  }
  else {
    memory._4_4_ = 0x12;
  }
  return memory._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_svg_glyph_init( FT_Glyph      svg_glyph,
                     FT_GlyphSlot  slot )
  {
    FT_ULong         doc_length;
    FT_SVG_Document  document;
    FT_SvgGlyph      glyph = (FT_SvgGlyph)svg_glyph;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = FT_GLYPH( glyph )->library->memory;


    if ( slot->format != FT_GLYPH_FORMAT_SVG )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    if ( slot->other == NULL )
    {
      error = FT_THROW( Invalid_Slot_Handle );
      goto Exit;
    }

    document = (FT_SVG_Document)slot->other;

    if ( document->svg_document_length == 0 )
    {
      error = FT_THROW( Invalid_Slot_Handle );
      goto Exit;
    }

    /* allocate a new document */
    doc_length = document->svg_document_length;
    if ( FT_QALLOC( glyph->svg_document, doc_length ) )
      goto Exit;
    glyph->svg_document_length = doc_length;

    glyph->glyph_index = slot->glyph_index;

    glyph->metrics      = document->metrics;
    glyph->units_per_EM = document->units_per_EM;

    glyph->start_glyph_id = document->start_glyph_id;
    glyph->end_glyph_id   = document->end_glyph_id;

    glyph->transform = document->transform;
    glyph->delta     = document->delta;

    /* copy the document into glyph */
    FT_MEM_COPY( glyph->svg_document, document->svg_document, doc_length );

  Exit:
    return error;
  }